

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O2

bool __thiscall embree::XML::hasChild(XML *this,string *childID)

{
  pointer pRVar1;
  ulong uVar2;
  __type _Var3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    pRVar1 = (this->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->children).
                  super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3;
    if (uVar5 <= uVar4) break;
    _Var3 = std::operator==(&(pRVar1[uVar4].ptr)->name,childID);
    uVar2 = uVar4 + 1;
  } while (!_Var3);
  return uVar4 < uVar5;
}

Assistant:

bool hasChild(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return true;
      return false;
    }